

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteReg5U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,RegSlot R4,
          uint index)

{
  bool bVar1;
  undefined2 local_1c;
  undefined2 local_1a;
  undefined2 local_18;
  undefined2 local_16;
  OpLayoutT_Reg5U<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((((DAT_0159efbd == '\0') && (local_1c = (undefined2)R0, R0 < 0x10000)) &&
      (local_1a = (undefined2)R1, R1 < 0x10000)) &&
     (((local_18 = (undefined2)R2, R2 < 0x10000 && (local_16 = (undefined2)R3, R3 < 0x10000)) &&
      ((layout.R0 = (RegSlotType)R4, R4 < 0x10000 &&
       (layout.R1 = (RegSlotType)index, index < 0x10000)))))) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,&local_1c,0xc);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteReg5U(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, uint index)
    {
        OpLayoutT_Reg5U<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2)
            && SizePolicy::Assign(layout.R3, R3) && SizePolicy::Assign(layout.R4, R4) && SizePolicy::Assign(layout.SlotIndex, index))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }